

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_struct_member
          (CompilerGLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t param_5)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  Decoration *pDVar5;
  bool local_17a;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [39];
  bool local_b1;
  undefined1 local_b0 [7];
  bool is_block;
  string qualifiers;
  Vector<Decoration> *memb;
  Bitset memberflags;
  SPIRType *membertype;
  uint32_t param_5_local;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  memberflags.higher._M_h._M_single_bucket =
       (__node_base_ptr)
       Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,member_type_id);
  Bitset::Bitset((Bitset *)&memb);
  pmVar3 = ::std::
           unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  sVar4 = VectorView<diligent_spirv_cross::Meta::Decoration>::size
                    (&(pmVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>);
  if (index < sVar4) {
    pDVar5 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>,
                        (ulong)index);
    Bitset::operator=((Bitset *)&memb,&pDVar5->decoration_flags);
  }
  ::std::__cxx11::string::string((string *)local_b0);
  pmVar3 = ::std::
           unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  bVar2 = Bitset::get(&(pmVar3->decoration).decoration_flags,2);
  local_17a = true;
  if (!bVar2) {
    pmVar3 = ::std::
             unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
    local_17a = Bitset::get(&(pmVar3->decoration).decoration_flags,3);
  }
  local_b1 = local_17a;
  if (local_17a != false) {
    (*(this->super_Compiler)._vptr_Compiler[0x36])(local_d8,this,&memb);
    ::std::__cxx11::string::operator=((string *)local_b0,local_d8);
    ::std::__cxx11::string::~string(local_d8);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x35])(&local_f8,this,type,(ulong)index);
  flags_to_qualifiers_glsl_abi_cxx11_
            (&local_118,this,(SPIRType *)memberflags.higher._M_h._M_single_bucket,(Bitset *)&memb);
  p_Var1 = memberflags.higher._M_h._M_single_bucket;
  to_member_name_abi_cxx11_(&local_158,this,type,index);
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_138,this,p_Var1,&local_158,0);
  statement<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,&local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,qualifier
             ,&local_118,&local_138,(char (*) [2])0xf651e6);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)local_b0);
  Bitset::~Bitset((Bitset *)&memb);
  return;
}

Assistant:

void CompilerGLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string qualifiers;
	bool is_block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
	                ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

	if (is_block)
		qualifiers = to_interpolation_qualifiers(memberflags);

	statement(layout_for_member(type, index), qualifiers, qualifier, flags_to_qualifiers_glsl(membertype, memberflags),
	          variable_decl(membertype, to_member_name(type, index)), ";");
}